

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O1

MallocBlock * MallocBlock::Allocate(size_t size,int type)

{
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  void *pvVar7;
  int *piVar8;
  ThreadCache *heap;
  uint in_ECX;
  size_t sVar9;
  ulong uVar10;
  size_t __len;
  FreeList *pFVar11;
  ulong k;
  MallocBlock *this;
  long *in_FS_OFFSET;
  ThreadCachePtr TVar12;
  SafeStrError local_70;
  int local_44;
  size_t local_40;
  char local_31;
  
  if (Allocate::max_size_t - 0x30 < size) {
    RAW_LOG(-3,"Massive size passed to malloc: %zu",size);
    return (MallocBlock *)0x0;
  }
  local_31 = FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_page_fence;
  local_44 = type;
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::FLAGS_malloc_page_fence ==
      '\x01') {
    local_40 = CONCAT44(local_40._4_4_,
                        (uint)FLAG__namespace_do_not_use_directly_use_DECLARE_bool_instead::
                              FLAGS_malloc_page_fence_readable);
    uVar10 = size + 0x2f & 0xfffffffffffffff0;
    iVar4 = getpagesize();
    __len = (size_t)iVar4;
    iVar5 = (int)(((uVar10 + __len) - 1) / __len);
    pvVar7 = mmap((void *)0x0,(long)(iVar4 * (iVar5 + 1)),3,0x22,-1,0);
    if (pvVar7 == (void *)0xffffffffffffffff) {
      piVar8 = __errno_location();
      tcmalloc::SafeStrError::SafeStrError(&local_70,*piVar8);
      RAW_LOG(-4,"Out of memory: possibly due to page fence overhead: %s",local_70.result_);
    }
    pvVar7 = (void *)((long)pvVar7 + (long)(iVar5 * iVar4));
    iVar4 = mprotect(pvVar7,__len,(int)local_40);
    if (iVar4 != 0) {
      piVar8 = __errno_location();
      tcmalloc::SafeStrError::SafeStrError(&local_70,*piVar8);
      RAW_LOG(-4,"Guard page setup failed: %s",local_70.result_);
    }
    this = (MallocBlock *)((long)pvVar7 - uVar10);
    goto LAB_0011946d;
  }
  uVar10 = size + 0x30;
  heap = (ThreadCache *)*in_FS_OFFSET;
  if (heap == (ThreadCache *)0x0) {
    TVar12 = tcmalloc::ThreadCachePtr::GetSlow();
    heap = TVar12.ptr_;
  }
  if (uVar10 < 0x401) {
    in_ECX = (int)uVar10 + 7U >> 3;
LAB_001193bf:
    bVar3 = true;
  }
  else {
    if (uVar10 < 0x40001) {
      in_ECX = (int)uVar10 + 0x3c7fU >> 7;
      goto LAB_001193bf;
    }
    bVar3 = false;
  }
  if (bVar3) {
    bVar1 = (&tcmalloc::Static::sizemap_)[in_ECX];
    iVar4 = (&DAT_00144e84)[bVar1];
    k = (ulong)iVar4;
    uVar2 = (heap->sampler_).bytes_until_sample_;
    if (uVar2 < k) {
      local_40 = uVar10;
      bVar3 = tcmalloc::Sampler::RecordAllocationSlow(&heap->sampler_,k);
      if (!bVar3) {
        this = (MallocBlock *)DoSampledAllocation(local_40);
        goto LAB_0011946d;
      }
    }
    else {
      (heap->sampler_).bytes_until_sample_ = uVar2 - k;
    }
    this = (MallocBlock *)heap->list_[bVar1].list_;
    if (this != (MallocBlock *)0x0) {
      pFVar11 = heap->list_ + bVar1;
      pFVar11->list_ = (void *)this->size1_;
      uVar6 = pFVar11->length_ - 1;
      pFVar11->length_ = uVar6;
      if (uVar6 < pFVar11->lowater_) {
        pFVar11->lowater_ = uVar6;
      }
      if (this != (MallocBlock *)0x0) {
        heap->size_ = heap->size_ - iVar4;
        goto LAB_0011946d;
      }
    }
    this = (MallocBlock *)
           tcmalloc::ThreadCache::FetchFromCentralCache
                     (heap,(uint)bVar1,iVar4,anon_unknown.dwarf_5160::nop_oom_handler);
  }
  else {
    this = (MallocBlock *)anon_unknown.dwarf_5160::do_malloc_pages(heap,uVar10);
  }
LAB_0011946d:
  if (this != (MallocBlock *)0x0) {
    sVar9 = 0xdeadbeef;
    if (local_31 != '\0') {
      sVar9 = 0xabcdefab;
    }
    this->magic1_ = sVar9;
    Initialize(this,size,local_44);
  }
  return this;
}

Assistant:

static MallocBlock* Allocate(size_t size, int type) {
    // Prevent an integer overflow / crash with large allocation sizes.
    // TODO - Note that for a e.g. 64-bit size_t, max_size_t may not actually
    // be the maximum value, depending on how the compiler treats ~0. The worst
    // practical effect is that allocations are limited to 4Gb or so, even if
    // the address space could take more.
    static size_t max_size_t = ~0;
    if (size > max_size_t - sizeof(MallocBlock)) {
      RAW_LOG(ERROR, "Massive size passed to malloc: %zu", size);
      return nullptr;
    }
    MallocBlock* b = nullptr;
    const bool use_malloc_page_fence = FLAGS_malloc_page_fence;
    const bool malloc_page_fence_readable = FLAGS_malloc_page_fence_readable;
#ifdef HAVE_MMAP
    if (use_malloc_page_fence) {
      // Put the block towards the end of the page and make the next page
      // inaccessible. This will catch buffer overrun right when it happens.
      size_t sz = real_mmapped_size(size);
      int pagesize = getpagesize();
      int num_pages = (sz + pagesize - 1) / pagesize + 1;
      char* p = (char*) mmap(nullptr, num_pages * pagesize, PROT_READ|PROT_WRITE,
                             MAP_PRIVATE|MAP_ANONYMOUS, -1, 0);
      if (p == MAP_FAILED) {
        // If the allocation fails, abort rather than returning nullptr to
        // malloc. This is because in most cases, the program will run out
        // of memory in this mode due to tremendous amount of wastage. There
        // is no point in propagating the error elsewhere.
        RAW_LOG(FATAL, "Out of memory: possibly due to page fence overhead: %s",
                tcmalloc::SafeStrError(errno).c_str());
      }
      // Mark the page after the block inaccessible
      if (mprotect(p + (num_pages - 1) * pagesize, pagesize,
                   PROT_NONE|(malloc_page_fence_readable ? PROT_READ : 0))) {
        RAW_LOG(FATAL, "Guard page setup failed: %s",
                tcmalloc::SafeStrError(errno).c_str());
      }
      b = (MallocBlock*) (p + (num_pages - 1) * pagesize - sz);
    } else {
      b = (MallocBlock*) do_malloc(real_malloced_size(size));
    }
#else
    b = (MallocBlock*) do_malloc(real_malloced_size(size));
#endif

    // It would be nice to output a diagnostic on allocation failure
    // here, but logging (other than FATAL) requires allocating
    // memory, which could trigger a nasty recursion. Instead, preserve
    // malloc semantics and return nullptr on failure.
    if (b != nullptr) {
      b->magic1_ = use_malloc_page_fence ? kMagicMMap : kMagicMalloc;
      b->Initialize(size, type);
    }
    return b;
  }